

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableBeginApplyRequests(ImGuiTable *table)

{
  ImSpan<ImGuiTableColumn> *this;
  float width;
  char cVar1;
  ImGuiTableColumn *pIVar2;
  char *pcVar3;
  ImGuiTableColumn *pIVar4;
  int column_n;
  int iVar5;
  char cVar6;
  
  if (table->InstanceCurrent == 0) {
    cVar6 = table->ResizedColumn;
    if (cVar6 == -1) {
      cVar6 = -1;
    }
    else {
      width = table->ResizedColumnNextWidth;
      if ((width != 3.4028235e+38) || (NAN(width))) {
        TableSetColumnWidth((int)cVar6,width);
        cVar6 = table->ResizedColumn;
      }
    }
    table->LastResizedColumn = cVar6;
    table->ResizedColumnNextWidth = 3.4028235e+38;
    table->ResizedColumn = -1;
    iVar5 = (int)table->AutoFitSingleColumn;
    if (iVar5 != -1) {
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar5);
      TableSetColumnWidth(iVar5,pIVar2->WidthAuto);
      table->AutoFitSingleColumn = -1;
    }
    if (table->InstanceCurrent == 0) {
      cVar6 = table->ReorderColumn;
      if (table->HeldHeaderColumn == -1) {
        if (cVar6 != -1) {
          table->ReorderColumn = -1;
        }
        table->HeldHeaderColumn = -1;
      }
      else {
        table->HeldHeaderColumn = -1;
        if (cVar6 != -1) {
          cVar1 = table->ReorderColumnDir;
          if (cVar1 != '\0') {
            if ((cVar1 != '\x01') && (cVar1 != -1)) {
              __assert_fail("reorder_dir == -1 || reorder_dir == +1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                            ,0x271,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
            }
            if ((table->Flags & 2) == 0) {
              __assert_fail("table->Flags & ImGuiTableFlags_Reorderable",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                            ,0x272,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
            }
            this = &table->Columns;
            pIVar2 = ImSpan<ImGuiTableColumn>::operator[](this,(int)cVar6);
            pIVar4 = ImSpan<ImGuiTableColumn>::operator[]
                               (this,(int)*(char *)((long)&pIVar2->Flags +
                                                   ((ulong)(cVar1 == -1) ^ 0x55)));
            iVar5 = (int)pIVar2->DisplayOrder;
            cVar6 = pIVar4->DisplayOrder;
            pIVar2->DisplayOrder = cVar6;
            while (cVar6 != iVar5) {
              iVar5 = iVar5 + cVar1;
              pcVar3 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,iVar5);
              pIVar2 = ImSpan<ImGuiTableColumn>::operator[](this,(int)*pcVar3);
              pIVar2->DisplayOrder = pIVar2->DisplayOrder - cVar1;
            }
            if ((int)cVar6 - (int)cVar1 != (int)pIVar4->DisplayOrder) {
              __assert_fail("dst_column->DisplayOrder == dst_order - reorder_dir",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui_tables.cpp"
                            ,0x27b,"void ImGui::TableBeginApplyRequests(ImGuiTable *)");
            }
            for (iVar5 = 0; iVar5 < table->ColumnsCount; iVar5 = iVar5 + 1) {
              pIVar2 = ImSpan<ImGuiTableColumn>::operator[](this,iVar5);
              pcVar3 = ImSpan<signed_char>::operator[]
                                 (&table->DisplayOrderToIndex,(int)pIVar2->DisplayOrder);
              *pcVar3 = (char)iVar5;
            }
            table->ReorderColumnDir = '\0';
            table->IsSettingsDirty = true;
          }
        }
      }
    }
  }
  if (table->IsResetDisplayOrderRequest == true) {
    for (iVar5 = 0; iVar5 < table->ColumnsCount; iVar5 = iVar5 + 1) {
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar5);
      pIVar2->DisplayOrder = (ImGuiTableColumnIdx)iVar5;
      pcVar3 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,iVar5);
      *pcVar3 = (ImGuiTableColumnIdx)iVar5;
    }
    table->IsResetDisplayOrderRequest = false;
    table->IsSettingsDirty = true;
  }
  return;
}

Assistant:

void ImGui::TableBeginApplyRequests(ImGuiTable* table)
{
    // Handle resizing request
    // (We process this at the first TableBegin of the frame)
    // FIXME-TABLE: Contains columns if our work area doesn't allow for scrolling?
    if (table->InstanceCurrent == 0)
    {
        if (table->ResizedColumn != -1 && table->ResizedColumnNextWidth != FLT_MAX)
            TableSetColumnWidth(table->ResizedColumn, table->ResizedColumnNextWidth);
        table->LastResizedColumn = table->ResizedColumn;
        table->ResizedColumnNextWidth = FLT_MAX;
        table->ResizedColumn = -1;

        // Process auto-fit for single column, which is a special case for stretch columns and fixed columns with FixedSame policy.
        // FIXME-TABLE: Would be nice to redistribute available stretch space accordingly to other weights, instead of giving it all to siblings.
        if (table->AutoFitSingleColumn != -1)
        {
            TableSetColumnWidth(table->AutoFitSingleColumn, table->Columns[table->AutoFitSingleColumn].WidthAuto);
            table->AutoFitSingleColumn = -1;
        }
    }

    // Handle reordering request
    // Note: we don't clear ReorderColumn after handling the request.
    if (table->InstanceCurrent == 0)
    {
        if (table->HeldHeaderColumn == -1 && table->ReorderColumn != -1)
            table->ReorderColumn = -1;
        table->HeldHeaderColumn = -1;
        if (table->ReorderColumn != -1 && table->ReorderColumnDir != 0)
        {
            // We need to handle reordering across hidden columns.
            // In the configuration below, moving C to the right of E will lead to:
            //    ... C [D] E  --->  ... [D] E  C   (Column name/index)
            //    ... 2  3  4        ...  2  3  4   (Display order)
            const int reorder_dir = table->ReorderColumnDir;
            IM_ASSERT(reorder_dir == -1 || reorder_dir == +1);
            IM_ASSERT(table->Flags & ImGuiTableFlags_Reorderable);
            ImGuiTableColumn* src_column = &table->Columns[table->ReorderColumn];
            ImGuiTableColumn* dst_column = &table->Columns[(reorder_dir == -1) ? src_column->PrevEnabledColumn : src_column->NextEnabledColumn];
            IM_UNUSED(dst_column);
            const int src_order = src_column->DisplayOrder;
            const int dst_order = dst_column->DisplayOrder;
            src_column->DisplayOrder = (ImGuiTableColumnIdx)dst_order;
            for (int order_n = src_order + reorder_dir; order_n != dst_order + reorder_dir; order_n += reorder_dir)
                table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder -= (ImGuiTableColumnIdx)reorder_dir;
            IM_ASSERT(dst_column->DisplayOrder == dst_order - reorder_dir);

            // Display order is stored in both columns->IndexDisplayOrder and table->DisplayOrder[],
            // rebuild the later from the former.
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
            table->ReorderColumnDir = 0;
            table->IsSettingsDirty = true;
        }
    }

    // Handle display order reset request
    if (table->IsResetDisplayOrderRequest)
    {
        for (int n = 0; n < table->ColumnsCount; n++)
            table->DisplayOrderToIndex[n] = table->Columns[n].DisplayOrder = (ImGuiTableColumnIdx)n;
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
    }
}